

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O3

void __thiscall write_sw::operator()(write_sw *this,ogf4_slide_window *sw,xr_writer *w)

{
  undefined4 in_EAX;
  undefined4 local_18;
  uint32_t local_14;
  
  _local_18 = CONCAT44(sw->offset,in_EAX);
  (*w->_vptr_xr_writer[2])(w,&local_14,4);
  _local_18 = CONCAT62(stack0xffffffffffffffea,sw->num_tris);
  (*w->_vptr_xr_writer[2])(w,&local_18,2);
  local_18 = CONCAT22(sw->num_verts,(undefined2)local_18);
  (*w->_vptr_xr_writer[2])(w,(long)&local_18 + 2,2);
  return;
}

Assistant:

void operator()(const ogf4_slide_window& sw, xr_writer& w) const {
	w.w_u32(sw.offset);
	w.w_u16(sw.num_tris);
	w.w_u16(sw.num_verts);
}